

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

QString * quotedStringLiteral(QString *__return_storage_ptr__,QString *value)

{
  char16_t cVar1;
  uint uVar2;
  qsizetype qVar3;
  QChar QVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QStringBuilder<QLatin1String,_QString> local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar2 = (uint)(value->d).size;
  QString::reserve(__return_storage_ptr__,(long)((int)((double)(int)uVar2 * 1.1) + 2));
  QVar4.ucs = (char16_t)__return_storage_ptr__;
  QString::append(QVar4);
  uVar7 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar7;
  }
  do {
    if (uVar6 == uVar7) {
      QString::append(QVar4);
      QString::squeeze(__return_storage_ptr__);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    cVar1 = (value->d).ptr[uVar7];
    switch(cVar1) {
    case L'\b':
      pcVar5 = "\\b";
      break;
    case L'\t':
      pcVar5 = "\\t";
      break;
    case L'\n':
      pcVar5 = "\\n";
      break;
    case L'\v':
    case L'\f':
switchD_0012df25_caseD_b:
      if ((ushort)(cVar1 + L'￠') < 0x60) {
        QString::append(QVar4);
      }
      else {
        qVar3 = QtPrivate::lengthHelperPointer<char>("\\u");
        QString::number((int)&local_90,(uint)(ushort)cVar1);
        QString::rightJustified((longlong)&local_78,(QChar)(char16_t)&local_90,true);
        local_60.b.d.size = local_78.size;
        local_60.b.d.ptr = local_78.ptr;
        local_60.b.d.d = local_78.d;
        local_60.a.m_data = "\\u";
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        local_78.size = 0;
        local_60.a.m_size = qVar3;
        operator+=(__return_storage_ptr__,&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60.b.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      }
      goto LAB_0012dfa9;
    case L'\r':
      pcVar5 = "\\r";
      break;
    default:
      if (cVar1 == L'\"') {
        pcVar5 = "\\\"";
      }
      else {
        if (cVar1 != L'\\') goto switchD_0012df25_caseD_b;
        pcVar5 = "\\\\";
      }
      QtPrivate::lengthHelperPointer<char>(pcVar5);
      goto LAB_0012dfa4;
    }
    QtPrivate::lengthHelperPointer<char>(pcVar5);
LAB_0012dfa4:
    QString::append((QLatin1String *)__return_storage_ptr__);
LAB_0012dfa9:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static QString quotedStringLiteral(const QString &value)
{
    QString result;
    const int len = value.size();
    result.reserve(int(len * 1.1) + 2);

    result += QLatin1Char('"');

    // Escape
    for (int i = 0; i < len; ++i) {
        QChar character = value.at(i);
        ushort code = character.unicode();
        switch (code) {
        case '\\':
            result += QLatin1String("\\\\");
            break;
        case '"':
            result += QLatin1String("\\\"");
            break;
        case '\b':
            result += QLatin1String("\\b");
            break;
        case '\n':
            result += QLatin1String("\\n");
            break;
        case '\r':
            result += QLatin1String("\\r");
            break;
        case '\t':
            result += QLatin1String("\\t");
            break;
        default:
            if (code >= 32 && code <= 127)
                result += character;
            else
                result += QLatin1String("\\u") + QString::number(code, 16).rightJustified(4, '0');
        }
    }

    result += QLatin1Char('"');

    result.squeeze();
    return result;
}